

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_operations.cpp
# Opt level: O3

void Am_Update(Am_Object *window)

{
  Am_Draw_Method_Type *pAVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Window_ToDo *this;
  Am_Value value;
  Am_Draw_Method draw_method;
  Am_Object local_40;
  Am_Value local_38;
  Am_Draw_Method local_28;
  
  local_38.type = 0;
  local_38.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar3 = Am_Object::Get(window,0x7d6,1);
  Am_Value::operator=(&local_38,pAVar3);
  bVar2 = Am_Value::Valid(&local_38);
  if (bVar2) {
    this = (Am_Window_ToDo *)Am_Value::operator_cast_to_void_(&local_38);
    if (this->flags != 0) {
      Am_Window_ToDo::Remove(this);
      local_28.from_wrapper = (Am_Method_Wrapper *)0x0;
      local_28.Call = (Am_Draw_Method_Type *)0x0;
      pAVar3 = Am_Object::Get(window,2000,0);
      Am_Draw_Method::operator=(&local_28,pAVar3);
      pAVar1 = local_28.Call;
      Am_Object::Am_Object(&local_40,window);
      (*pAVar1)((Am_Object_Data *)&local_40,(Am_Drawonable *)0x0,0,0);
      Am_Object::~Am_Object(&local_40);
    }
  }
  Am_Value::~Am_Value(&local_38);
  return;
}

Assistant:

void
Am_Update(Am_Object window)
{
  Am_Value value;
  value = window.Peek(Am_TODO);
  if (value.Valid()) {
    Am_Window_ToDo *win_todo = Am_Window_ToDo::Narrow(value);
    if (win_todo->flags) {
      win_todo->Remove();
      Am_Draw_Method draw_method;
      draw_method = window.Get(Am_DRAW_METHOD);
      //ignores drawonable and offset parameters
      draw_method.Call(window, nullptr, 0, 0);
    }
  }
}